

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O2

string * __thiscall
license::os::CPUVendorID::toString_abi_cxx11_(string *__return_storage_ptr__,CPUVendorID *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,this + 1);
  return __return_storage_ptr__;
}

Assistant:

string toString() const { return string(reinterpret_cast<const char *>(this), 12); }